

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O2

void __thiscall
hwtest::pgraph::MthdKelvinLightSpotCutoffB::emulate_mthd(MthdKelvinLightSpotCutoffB *this)

{
  pgraph_state *state;
  _Bool _Var1;
  uint32_t which;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_kelvin_check_err19(state);
  _Var1 = pgraph_in_begin_end(state);
  if (_Var1) {
    MthdTest::warn((MthdTest *)this,4);
    return;
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type == 0x20) {
    which = this->which + 7;
  }
  else {
    which = this->which + 5;
  }
  pgraph_ld_ltc(state,2,which,(this->super_SingleMthdTest).super_MthdTest.val);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		uint32_t err = 0;
		if (pgraph_in_begin_end(&exp))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!exp.nsource) {
				if (chipset.card_type == 0x20)
					pgraph_ld_ltc(&exp, 2, 0x7 + which, val);
				else
					pgraph_ld_ltc(&exp, 2, 0x5 + which, val);
			}
		}
	}